

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O0

void __thiscall
CVmImagePool::set_page_info
          (CVmImagePool *this,ulong page_idx,long seek_pos,size_t page_size,uchar xor_mask)

{
  CVmImagePool_pg *pCVar1;
  size_t in_RCX;
  long in_RDX;
  ulong in_RSI;
  CVmImagePool *in_RDI;
  uchar in_R8B;
  CVmImagePool_pg *info;
  
  if (in_RDI->page_info_ == (CVmImagePool_pg **)0x0) {
    err_throw(0);
  }
  if (in_RDI->page_count_ <= in_RSI) {
    err_throw(0);
  }
  pCVar1 = get_page_info(in_RDI,in_RSI);
  pCVar1->seek_pos = in_RDX;
  pCVar1->page_size = in_RCX;
  pCVar1->xor_mask = in_R8B;
  return;
}

Assistant:

void CVmImagePool::set_page_info(ulong page_idx, long seek_pos,
                                 size_t page_size, uchar xor_mask)
{
    CVmImagePool_pg *info;
    
    /* 
     *   make sure we've allocated the page array and that this index is
     *   in range -- throw an error if not 
     */
    if (page_info_ == 0)
        err_throw(VMERR_IMAGE_POOL_BEFORE_DEF);
    if (page_idx >= page_count_)
        err_throw(VMERR_IMAGE_POOL_BAD_PAGE);

    /* get the entry for this page */
    info = get_page_info(page_idx);

    /* set the information */
    info->seek_pos = seek_pos;
    info->page_size = page_size;
    info->xor_mask = xor_mask;
}